

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O1

void __thiscall
helics::FilterFederate::addFilteredEndpoint(FilterFederate *this,json *block,GlobalFederateId fed)

{
  value_t vVar1;
  _Rb_tree_color _Var2;
  json_value jVar3;
  _Base_ptr p_Var4;
  size_type sVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  uint uVar7;
  _Rb_tree_color __val;
  uint uVar8;
  uint uVar9;
  reference pvVar10;
  BasicHandleInfo *pBVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  _Rb_tree_node_base *p_Var13;
  ulong uVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  uint uVar16;
  uint uVar17;
  undefined8 uVar18;
  _Base_ptr p_Var19;
  initializer_list_t init;
  string srcFilters;
  string __str_2;
  string __str;
  string __str_1;
  json eptBlock;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  _Base_ptr local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  BaseType local_d4;
  FilterFederate *local_d0;
  data local_c8;
  data local_b8;
  data local_a8;
  data local_98;
  data local_88;
  data local_78;
  data local_68;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *local_58;
  _Rb_tree_node_base *local_50;
  _Rb_tree_node_base *local_48;
  data local_40;
  
  init._M_len._4_4_ = 0;
  init._0_12_ = ZEXT812(0);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_40,init,false,array);
  local_58 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              *)block;
  pvVar10 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        *)block,"endpoints");
  vVar1 = (pvVar10->m_data).m_type;
  (pvVar10->m_data).m_type = local_40.m_type;
  jVar3 = (pvVar10->m_data).m_value;
  (pvVar10->m_data).m_value = local_40.m_value;
  local_40.m_type = vVar1;
  local_40.m_value = jVar3;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_40);
  p_Var13 = (this->filterCoord)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_48 = &(this->filterCoord)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_d4 = fed.gid;
  local_d0 = this;
  if (p_Var13 != local_48) {
    do {
      local_100 = p_Var13[1]._M_parent;
      pBVar11 = HandleManager::getInterfaceHandle
                          (this->mHandles,(InterfaceHandle)p_Var13[1]._M_color,ENDPOINT);
      if ((pBVar11->handle).fed_id.gid == fed.gid) {
        local_68.m_type = null;
        local_68.m_value.object = (object_t *)0x0;
        local_50 = p_Var13;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_78,&pBVar11->key);
        pvVar10 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_68,"name");
        vVar1 = (pvVar10->m_data).m_type;
        (pvVar10->m_data).m_type = local_78.m_type;
        jVar3 = (pvVar10->m_data).m_value;
        (pvVar10->m_data).m_value = local_78.m_value;
        local_78.m_type = vVar1;
        local_78.m_value = jVar3;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_78);
        local_c8.m_type = null;
        local_c8._1_7_ = 0;
        local_c8.m_value.object = (object_t *)0x0;
        nlohmann::json_abi_v3_11_3::detail::
        external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
        construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_c8,(long)(pBVar11->handle).handle.hid);
        pvVar10 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_68,anon_var_dwarf_70a93 + 0x27);
        vVar1 = (pvVar10->m_data).m_type;
        (pvVar10->m_data).m_type = local_c8.m_type;
        local_c8.m_type = vVar1;
        jVar3 = (pvVar10->m_data).m_value;
        (pvVar10->m_data).m_value.object = (object_t *)local_c8.m_value;
        local_c8.m_value = jVar3;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_c8);
        if (*(char *)&local_100[2]._M_left == '\x01') {
          local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"[","");
          p_Var19 = *(_Base_ptr *)local_100;
          p_Var4 = local_100->_M_parent;
          while( true ) {
            if (p_Var19 == p_Var4) break;
            sVar5 = *(size_type *)(*(long *)p_Var19 + 0x10);
            if (sVar5 == 0) {
              uVar17 = **(uint **)p_Var19;
              uVar7 = -uVar17;
              if (0 < (int)uVar17) {
                uVar7 = uVar17;
              }
              uVar16 = 1;
              if (9 < uVar7) {
                uVar14 = (ulong)uVar7;
                uVar8 = 4;
                do {
                  uVar16 = uVar8;
                  uVar9 = (uint)uVar14;
                  if (uVar9 < 100) {
                    uVar16 = uVar16 - 2;
                    goto LAB_0031525e;
                  }
                  if (uVar9 < 1000) {
                    uVar16 = uVar16 - 1;
                    goto LAB_0031525e;
                  }
                  if (uVar9 < 10000) goto LAB_0031525e;
                  uVar14 = uVar14 / 10000;
                  uVar8 = uVar16 + 4;
                } while (99999 < uVar9);
                uVar16 = uVar16 + 1;
              }
LAB_0031525e:
              local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_construct(&local_120,(ulong)(uVar16 + -((int)uVar17 >> 0x1f)),'-');
              CLI::std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_120._M_dataplus._M_p + (uint)-((int)uVar17 >> 0x1f),uVar16,uVar7);
              pbVar12 = CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                        _M_replace_aux(&local_120,local_120._M_string_length,0,1,':');
              local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
              paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(pbVar12->_M_dataplus)._M_p;
              paVar15 = &pbVar12->field_2;
              if (paVar6 == paVar15) {
                local_140.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
                local_140.field_2._8_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
              }
              else {
                local_140.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
                local_140._M_dataplus._M_p = (pointer)paVar6;
              }
              local_140._M_string_length = pbVar12->_M_string_length;
              (pbVar12->_M_dataplus)._M_p = (pointer)paVar15;
              pbVar12->_M_string_length = 0;
              (pbVar12->field_2)._M_local_buf[0] = '\0';
              uVar17 = *(uint *)(*(long *)p_Var19 + 4);
              uVar7 = -uVar17;
              if (0 < (int)uVar17) {
                uVar7 = uVar17;
              }
              uVar16 = 1;
              if (9 < uVar7) {
                uVar14 = (ulong)uVar7;
                uVar8 = 4;
                do {
                  uVar16 = uVar8;
                  uVar9 = (uint)uVar14;
                  if (uVar9 < 100) {
                    uVar16 = uVar16 - 2;
                    goto LAB_00315350;
                  }
                  if (uVar9 < 1000) {
                    uVar16 = uVar16 - 1;
                    goto LAB_00315350;
                  }
                  if (uVar9 < 10000) goto LAB_00315350;
                  uVar14 = uVar14 / 10000;
                  uVar8 = uVar16 + 4;
                } while (99999 < uVar9);
                uVar16 = uVar16 + 1;
              }
LAB_00315350:
              local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_construct(&local_f8,(ulong)(uVar16 + -((int)uVar17 >> 0x1f)),'-');
              CLI::std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_f8._M_dataplus._M_p + (uint)-((int)uVar17 >> 0x1f),uVar16,uVar7);
              uVar18 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_140._M_dataplus._M_p != &local_140.field_2) {
                uVar18 = local_140.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar18 < local_f8._M_string_length + local_140._M_string_length) {
                uVar18 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                  uVar18 = local_f8.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar18 < local_f8._M_string_length + local_140._M_string_length)
                goto LAB_003153eb;
                pbVar12 = CLI::std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                    (&local_f8,0,0,local_140._M_dataplus._M_p,
                                     local_140._M_string_length);
              }
              else {
LAB_003153eb:
                pbVar12 = CLI::std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                          _M_append(&local_140,local_f8._M_dataplus._M_p,local_f8._M_string_length);
              }
              local_160._M_dataplus._M_p = (pbVar12->_M_dataplus)._M_p;
              paVar6 = &pbVar12->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p == paVar6) {
                local_160.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
                local_160.field_2._8_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
                local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
              }
              else {
                local_160.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
              }
              local_160._M_string_length = pbVar12->_M_string_length;
              (pbVar12->_M_dataplus)._M_p = (pointer)paVar6;
              pbVar12->_M_string_length = 0;
              paVar6->_M_local_buf[0] = '\0';
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_180,local_160._M_dataplus._M_p,local_160._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p != &local_160.field_2) {
                operator_delete(local_160._M_dataplus._M_p,
                                local_160.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_140._M_dataplus._M_p != &local_140.field_2) {
                operator_delete(local_140._M_dataplus._M_p,
                                local_140.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_120._M_dataplus._M_p != &local_120.field_2) {
                operator_delete(local_120._M_dataplus._M_p,
                                local_120.field_2._M_allocated_capacity + 1);
              }
            }
            else {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_180,*(char **)(*(long *)p_Var19 + 8),sVar5);
            }
            if (*(char *)(*(long *)p_Var19 + 0x99) == '\x01') {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_180,"(cloning)");
            }
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back(&local_180,',');
            p_Var19 = (_Base_ptr)&p_Var19->_M_parent;
          }
          if (local_180._M_dataplus._M_p[local_180._M_string_length - 1] == ',') {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            pop_back(&local_180);
          }
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back(&local_180,']');
          this = local_d0;
          fed.gid = local_d4;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_88,&local_180);
          pvVar10 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)&local_68,"srcFilters");
          vVar1 = (pvVar10->m_data).m_type;
          (pvVar10->m_data).m_type = local_88.m_type;
          jVar3 = (pvVar10->m_data).m_value;
          (pvVar10->m_data).m_value = local_88.m_value;
          local_88.m_type = vVar1;
          local_88.m_value = jVar3;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != &local_180.field_2) {
            operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
          }
        }
        if (*(char *)((long)&local_100[2]._M_left + 1) == '\x01') {
          p_Var19 = local_100->_M_right;
          if (p_Var19 != (_Base_ptr)0x0) {
            if (p_Var19->_M_left == (_Base_ptr)0x0) {
              _Var2 = local_100->_M_right->_M_color;
              __val = -_Var2;
              if (0 < (int)_Var2) {
                __val = _Var2;
              }
              uVar17 = 1;
              if (9 < __val) {
                uVar14 = (ulong)__val;
                uVar7 = 4;
                do {
                  uVar17 = uVar7;
                  uVar16 = (uint)uVar14;
                  if (uVar16 < 100) {
                    uVar17 = uVar17 - 2;
                    goto LAB_003156a9;
                  }
                  if (uVar16 < 1000) {
                    uVar17 = uVar17 - 1;
                    goto LAB_003156a9;
                  }
                  if (uVar16 < 10000) goto LAB_003156a9;
                  uVar14 = uVar14 / 10000;
                  uVar7 = uVar17 + 4;
                } while (99999 < uVar16);
                uVar17 = uVar17 + 1;
              }
LAB_003156a9:
              local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_construct(&local_140,(ulong)(uVar17 + -((int)_Var2 >> 0x1f)),'-');
              CLI::std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_140._M_dataplus._M_p + (uint)-((int)_Var2 >> 0x1f),uVar17,__val);
              pbVar12 = CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                        _M_replace_aux(&local_140,local_140._M_string_length,0,1,':');
              local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
              paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(pbVar12->_M_dataplus)._M_p;
              paVar15 = &pbVar12->field_2;
              if (paVar6 == paVar15) {
                local_160.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
                local_160.field_2._8_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
              }
              else {
                local_160.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
                local_160._M_dataplus._M_p = (pointer)paVar6;
              }
              local_160._M_string_length = pbVar12->_M_string_length;
              (pbVar12->_M_dataplus)._M_p = (pointer)paVar15;
              pbVar12->_M_string_length = 0;
              (pbVar12->field_2)._M_local_buf[0] = '\0';
              uVar17 = *(uint *)&local_100->_M_right->field_0x4;
              uVar7 = -uVar17;
              if (0 < (int)uVar17) {
                uVar7 = uVar17;
              }
              uVar16 = 1;
              if (9 < uVar7) {
                uVar14 = (ulong)uVar7;
                uVar8 = 4;
                do {
                  uVar16 = uVar8;
                  uVar9 = (uint)uVar14;
                  if (uVar9 < 100) {
                    uVar16 = uVar16 - 2;
                    goto LAB_0031579e;
                  }
                  if (uVar9 < 1000) {
                    uVar16 = uVar16 - 1;
                    goto LAB_0031579e;
                  }
                  if (uVar9 < 10000) goto LAB_0031579e;
                  uVar14 = uVar14 / 10000;
                  uVar8 = uVar16 + 4;
                } while (99999 < uVar9);
                uVar16 = uVar16 + 1;
              }
LAB_0031579e:
              local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_construct(&local_120,(ulong)(uVar16 + -((int)uVar17 >> 0x1f)),'-');
              CLI::std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_120._M_dataplus._M_p + (uint)-((int)uVar17 >> 0x1f),uVar16,uVar7);
              uVar18 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p != &local_160.field_2) {
                uVar18 = local_160.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar18 < local_120._M_string_length + local_160._M_string_length) {
                uVar18 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_120._M_dataplus._M_p != &local_120.field_2) {
                  uVar18 = local_120.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar18 < local_120._M_string_length + local_160._M_string_length)
                goto LAB_00315829;
                pbVar12 = CLI::std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                    (&local_120,0,0,local_160._M_dataplus._M_p,
                                     local_160._M_string_length);
              }
              else {
LAB_00315829:
                pbVar12 = CLI::std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                          _M_append(&local_160,local_120._M_dataplus._M_p,local_120._M_string_length
                                   );
              }
              local_180._M_dataplus._M_p = (pbVar12->_M_dataplus)._M_p;
              paVar6 = &pbVar12->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_180._M_dataplus._M_p == paVar6) {
                local_180.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
                local_180.field_2._8_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
                local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
              }
              else {
                local_180.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
              }
              local_180._M_string_length = pbVar12->_M_string_length;
              (pbVar12->_M_dataplus)._M_p = (pointer)paVar6;
              pbVar12->_M_string_length = 0;
              paVar6->_M_local_buf[0] = '\0';
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_a8,&local_180);
              pvVar10 = nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                    *)&local_68,"destFilter");
              vVar1 = (pvVar10->m_data).m_type;
              (pvVar10->m_data).m_type = local_a8.m_type;
              jVar3 = (pvVar10->m_data).m_value;
              (pvVar10->m_data).m_value = local_a8.m_value;
              local_a8.m_type = vVar1;
              local_a8.m_value = jVar3;
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::data::~data(&local_a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_180._M_dataplus._M_p != &local_180.field_2) {
                operator_delete(local_180._M_dataplus._M_p,
                                local_180.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_120._M_dataplus._M_p != &local_120.field_2) {
                operator_delete(local_120._M_dataplus._M_p,
                                local_120.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p != &local_160.field_2) {
                operator_delete(local_160._M_dataplus._M_p,
                                local_160.field_2._M_allocated_capacity + 1);
              }
              this = local_d0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_140._M_dataplus._M_p != &local_140.field_2) {
                operator_delete(local_140._M_dataplus._M_p,
                                local_140.field_2._M_allocated_capacity + 1);
              }
            }
            else {
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_98,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &p_Var19->_M_parent);
              pvVar10 = nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                    *)&local_68,"destFilter");
              vVar1 = (pvVar10->m_data).m_type;
              (pvVar10->m_data).m_type = local_98.m_type;
              jVar3 = (pvVar10->m_data).m_value;
              (pvVar10->m_data).m_value = local_98.m_value;
              local_98.m_type = vVar1;
              local_98.m_value = jVar3;
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::data::~data(&local_98);
            }
          }
          if (local_100[1]._M_right != *(_Base_ptr *)(local_100 + 2)) {
            local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"[","");
            p_Var19 = local_100[1]._M_right;
            p_Var4 = *(_Base_ptr *)(local_100 + 2);
            while( true ) {
              if (p_Var19 == p_Var4) break;
              sVar5 = *(size_type *)(*(long *)p_Var19 + 0x10);
              if (sVar5 == 0) {
                uVar17 = **(uint **)p_Var19;
                uVar7 = -uVar17;
                if (0 < (int)uVar17) {
                  uVar7 = uVar17;
                }
                uVar16 = 1;
                if (9 < uVar7) {
                  uVar14 = (ulong)uVar7;
                  uVar8 = 4;
                  do {
                    uVar16 = uVar8;
                    uVar9 = (uint)uVar14;
                    if (uVar9 < 100) {
                      uVar16 = uVar16 - 2;
                      goto LAB_00315a0f;
                    }
                    if (uVar9 < 1000) {
                      uVar16 = uVar16 - 1;
                      goto LAB_00315a0f;
                    }
                    if (uVar9 < 10000) goto LAB_00315a0f;
                    uVar14 = uVar14 / 10000;
                    uVar8 = uVar16 + 4;
                  } while (99999 < uVar9);
                  uVar16 = uVar16 + 1;
                }
LAB_00315a0f:
                local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::_M_construct(&local_120,(ulong)(uVar16 + -((int)uVar17 >> 0x1f)),'-');
                CLI::std::__detail::__to_chars_10_impl<unsigned_int>
                          (local_120._M_dataplus._M_p + (uint)-((int)uVar17 >> 0x1f),uVar16,uVar7);
                pbVar12 = CLI::std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                          _M_replace_aux(&local_120,local_120._M_string_length,0,1,':');
                local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
                paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(pbVar12->_M_dataplus)._M_p;
                paVar15 = &pbVar12->field_2;
                if (paVar6 == paVar15) {
                  local_140.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
                  local_140.field_2._8_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
                }
                else {
                  local_140.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
                  local_140._M_dataplus._M_p = (pointer)paVar6;
                }
                local_140._M_string_length = pbVar12->_M_string_length;
                (pbVar12->_M_dataplus)._M_p = (pointer)paVar15;
                pbVar12->_M_string_length = 0;
                (pbVar12->field_2)._M_local_buf[0] = '\0';
                uVar17 = *(uint *)(*(long *)p_Var19 + 4);
                uVar7 = -uVar17;
                if (0 < (int)uVar17) {
                  uVar7 = uVar17;
                }
                uVar16 = 1;
                if (9 < uVar7) {
                  uVar14 = (ulong)uVar7;
                  uVar8 = 4;
                  do {
                    uVar16 = uVar8;
                    uVar9 = (uint)uVar14;
                    if (uVar9 < 100) {
                      uVar16 = uVar16 - 2;
                      goto LAB_00315b01;
                    }
                    if (uVar9 < 1000) {
                      uVar16 = uVar16 - 1;
                      goto LAB_00315b01;
                    }
                    if (uVar9 < 10000) goto LAB_00315b01;
                    uVar14 = uVar14 / 10000;
                    uVar8 = uVar16 + 4;
                  } while (99999 < uVar9);
                  uVar16 = uVar16 + 1;
                }
LAB_00315b01:
                local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::_M_construct(&local_f8,(ulong)(uVar16 + -((int)uVar17 >> 0x1f)),'-');
                CLI::std::__detail::__to_chars_10_impl<unsigned_int>
                          (local_f8._M_dataplus._M_p + (uint)-((int)uVar17 >> 0x1f),uVar16,uVar7);
                uVar18 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_140._M_dataplus._M_p != &local_140.field_2) {
                  uVar18 = local_140.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar18 < local_f8._M_string_length + local_140._M_string_length) {
                  uVar18 = 0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                    uVar18 = local_f8.field_2._M_allocated_capacity;
                  }
                  if ((ulong)uVar18 < local_f8._M_string_length + local_140._M_string_length)
                  goto LAB_00315b9c;
                  pbVar12 = CLI::std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            replace(&local_f8,0,0,local_140._M_dataplus._M_p,
                                    local_140._M_string_length);
                }
                else {
LAB_00315b9c:
                  pbVar12 = CLI::std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            _M_append(&local_140,local_f8._M_dataplus._M_p,local_f8._M_string_length
                                     );
                }
                local_160._M_dataplus._M_p = (pbVar12->_M_dataplus)._M_p;
                paVar6 = &pbVar12->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_160._M_dataplus._M_p == paVar6) {
                  local_160.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
                  local_160.field_2._8_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
                  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
                }
                else {
                  local_160.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
                }
                local_160._M_string_length = pbVar12->_M_string_length;
                (pbVar12->_M_dataplus)._M_p = (pointer)paVar6;
                pbVar12->_M_string_length = 0;
                paVar6->_M_local_buf[0] = '\0';
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::_M_append(&local_180,local_160._M_dataplus._M_p,local_160._M_string_length);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_160._M_dataplus._M_p != &local_160.field_2) {
                  operator_delete(local_160._M_dataplus._M_p,
                                  local_160.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                  operator_delete(local_f8._M_dataplus._M_p,
                                  local_f8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_140._M_dataplus._M_p != &local_140.field_2) {
                  operator_delete(local_140._M_dataplus._M_p,
                                  local_140.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_120._M_dataplus._M_p != &local_120.field_2) {
                  operator_delete(local_120._M_dataplus._M_p,
                                  local_120.field_2._M_allocated_capacity + 1);
                }
              }
              else {
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::_M_append(&local_180,*(char **)(*(long *)p_Var19 + 8),sVar5);
              }
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              push_back(&local_180,',');
              p_Var19 = (_Base_ptr)&p_Var19->_M_parent;
            }
            if (local_180._M_dataplus._M_p[local_180._M_string_length - 1] == ',') {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              pop_back(&local_180);
            }
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back(&local_180,']');
            this = local_d0;
            fed.gid = local_d4;
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_b8,&local_180);
            pvVar10 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      ::operator[]<char_const>
                                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                  *)&local_68,"cloningdestFilter");
            vVar1 = (pvVar10->m_data).m_type;
            (pvVar10->m_data).m_type = local_b8.m_type;
            jVar3 = (pvVar10->m_data).m_value;
            (pvVar10->m_data).m_value = local_b8.m_value;
            local_b8.m_type = vVar1;
            local_b8.m_value = jVar3;
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(&local_b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._M_dataplus._M_p != &local_180.field_2) {
              operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
        pvVar10 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>(local_58,"endpoints");
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::push_back(pvVar10,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                             *)&local_68);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_68);
        p_Var13 = local_50;
      }
      p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
    } while (p_Var13 != local_48);
  }
  return;
}

Assistant:

void FilterFederate::addFilteredEndpoint(nlohmann::json& block, GlobalFederateId fed) const
{
    block["endpoints"] = nlohmann::json::array();
    for (const auto& filt : filterCoord) {
        auto* fc = filt.second.get();
        const auto* ep = mHandles->getInterfaceHandle(filt.first, InterfaceType::ENDPOINT);
        if (ep->getFederateId() != fed) {
            continue;
        }
        nlohmann::json eptBlock;

        eptBlock["name"] = ep->key;
        eptBlock["id"] = ep->handle.handle.baseValue();
        if (fc->hasSourceFilters) {
            std::string srcFilters = "[";
            for (auto& fcc : fc->sourceFilters) {
                if (!fcc->key.empty()) {
                    srcFilters.append(fcc->key);
                } else {
                    srcFilters += std::to_string(fcc->core_id.baseValue()) + ':' +
                        std::to_string(fcc->handle.baseValue());
                }
                if (fcc->cloning) {
                    srcFilters.append("(cloning)");
                }
                srcFilters.push_back(',');
            }
            if (srcFilters.back() == ',') {
                srcFilters.pop_back();
            }
            srcFilters.push_back(']');
            eptBlock["srcFilters"] = srcFilters;
        }
        if (fc->hasDestFilters) {
            if (fc->destFilter != nullptr) {
                if (!fc->destFilter->key.empty()) {
                    eptBlock["destFilter"] = fc->destFilter->key;
                } else {
                    eptBlock["destFilter"] = std::to_string(fc->destFilter->core_id.baseValue()) +
                        ':' + std::to_string(fc->destFilter->handle.baseValue());
                }
            }
            if (!fc->cloningDestFilters.empty()) {
                std::string dcloningFilter = "[";
                for (auto& fcc : fc->cloningDestFilters) {
                    if (!fcc->key.empty()) {
                        dcloningFilter.append(fcc->key);
                    } else {
                        dcloningFilter += std::to_string(fcc->core_id.baseValue()) + ':' +
                            std::to_string(fcc->handle.baseValue());
                    }
                    dcloningFilter.push_back(',');
                }
                if (dcloningFilter.back() == ',') {
                    dcloningFilter.pop_back();
                }
                dcloningFilter.push_back(']');
                eptBlock["cloningdestFilter"] = dcloningFilter;
            }
        }
        block["endpoints"].push_back(std::move(eptBlock));
    }
}